

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdecompresshelper.cpp
# Opt level: O1

ssize_t __thiscall
QDecompressHelper::read(QDecompressHelper *this,int __fd,void *__buf,size_t __nbytes)

{
  ssize_t sVar1;
  qsizetype qVar2;
  undefined4 in_register_00000034;
  char *data;
  
  data = (char *)CONCAT44(in_register_00000034,__fd);
  if (0 < (long)__buf) {
    if (this->contentEncoding == None) {
      return -1;
    }
    if ((((this->compressedDataBuffer).bufferCompleteSize != 0) ||
        ((this->decoderHasData & 1U) != 0)) ||
       ((this->decompressedDataBuffer).bufferCompleteSize != 0)) {
      if ((this->decompressedDataBuffer).bufferCompleteSize == 0) {
        sVar1 = 0;
      }
      else {
        sVar1 = QByteDataBuffer::read(&this->decompressedDataBuffer,__fd,__buf,__nbytes);
        data = data + sVar1;
        __buf = (void *)((long)__buf - sVar1);
      }
      qVar2 = readInternal(this,data,(qsizetype)__buf);
      if (qVar2 == -1) {
        return -1;
      }
      this->totalBytesRead = this->totalBytesRead + qVar2 + sVar1;
      return qVar2 + sVar1;
    }
  }
  return 0;
}

Assistant:

qsizetype QDecompressHelper::read(char *data, qsizetype maxSize)
{
    if (maxSize <= 0)
        return 0;

    if (!isValid())
        return -1;

    if (!hasData())
        return 0;

    qsizetype cachedRead = 0;
    if (!decompressedDataBuffer.isEmpty()) {
        cachedRead = decompressedDataBuffer.read(data, maxSize);
        data += cachedRead;
        maxSize -= cachedRead;
    }

    qsizetype bytesRead = readInternal(data, maxSize);
    if (bytesRead == -1)
        return -1;
    totalBytesRead += bytesRead + cachedRead;
    return bytesRead + cachedRead;
}